

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O1

void graph_vis(t_gobj *gr,_glist *parent_glist,int vis)

{
  float fVar1;
  _gobj *p_Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  _rtext *p_Var7;
  _gobj *p_Var8;
  char *anchor;
  char *anchor_00;
  ulong uVar9;
  t_pd p_Var10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  t_float tVar14;
  t_float tVar15;
  float fVar16;
  t_float tVar17;
  float fVar18;
  double dVar19;
  float fVar20;
  char **ppcVar21;
  int y2;
  int x1;
  int x2;
  int y1;
  int local_dc;
  char *tags2 [2];
  char *tags3 [3];
  t_symbol *arrayname;
  char tag [50];
  
  tags2[0] = tag;
  tags2[1] = "graph";
  if (((ulong)gr[0xe].g_next & 0x100) == 0) {
    text_vis(gr,parent_glist,vis);
  }
  else {
    if (vis == 0) {
      graph_getrect(gr,parent_glist,&x1,&y1,&x2,&y2);
      p_Var7 = glist_findrtext(parent_glist,(t_text *)gr);
      rtext_erase(p_Var7);
      sprintf(tag,"graph%lx",gr);
      glist_eraseiofor(parent_glist,(t_object *)gr,tag);
    }
    else {
      iVar3 = canvas_showtext((_glist *)gr);
      if (iVar3 != 0) {
        p_Var7 = glist_findrtext(parent_glist,(t_text *)gr);
        rtext_draw(p_Var7);
      }
      graph_getrect(gr,parent_glist,&x1,&y1,&x2,&y2);
      sprintf(tag,"graph%lx",gr);
      glist_drawiofor(parent_glist,(t_object *)gr,1,tag,x1,y1,x2,y2);
    }
    if (((ulong)gr[0xe].g_next & 1) == 0) {
      if (vis == 0) {
        p_Var2 = gr[4].g_next;
        do {
          p_Var8 = p_Var2;
          if (p_Var8[4].g_next == (_gobj *)0x0) break;
          p_Var2 = p_Var8[4].g_next;
        } while (((ulong)p_Var8[0xe].g_next & 0x901) == 0x100);
        pdgui_vmess((char *)0x0,"crs",p_Var8,"delete",tag);
        for (p_Var10 = gr[3].g_pd; p_Var10 != (t_pd)0x0; p_Var10 = (t_pd)p_Var10->c_helpname) {
          gobj_vis((t_gobj *)p_Var10,(_glist *)gr,0);
        }
      }
      else {
        anchor = "e";
        if ((*(float *)&gr[5].g_next + *(float *)&gr[6].g_pd) * 0.5 < *(float *)&gr[0xb].g_next) {
          anchor = "w";
        }
        anchor_00 = "n";
        if ((*(float *)((long)&gr[5].g_next + 4) + *(float *)((long)&gr[6].g_pd + 4)) * 0.5 <
            *(float *)&gr[9].g_next) {
          anchor_00 = "s";
        }
        iVar3 = glist_getfont((_glist *)gr);
        iVar4 = glist_getzoom((_glist *)gr);
        local_dc = sys_hostfontsize(iVar3,iVar4);
        tags3[1] = "label";
        tags3[2] = "graph";
        p_Var2 = gr[4].g_next;
        do {
          p_Var8 = p_Var2;
          if (p_Var8[4].g_next == (_gobj *)0x0) break;
          p_Var2 = p_Var8[4].g_next;
        } while (((ulong)p_Var8[0xe].g_next & 0x901) == 0x100);
        uVar9 = (ulong)(uint)y1;
        tags3[0] = tag;
        uVar5 = glist_getzoom((_glist *)gr);
        pdgui_vmess((char *)0x0,"crr iiiiiiiiii ri rr rS",p_Var8,"create","line",(ulong)(uint)x1,
                    uVar9,(ulong)(uint)x1,(ulong)(uint)y2,(ulong)(uint)x2,(ulong)(uint)y2,
                    (ulong)(uint)x2,uVar9,(ulong)(uint)x1,uVar9,"-width",(ulong)uVar5,"-capstyle",
                    "projecting","-tags",2,tags2);
        p_Var10 = gr[3].g_pd;
        if (p_Var10 != (t_pd)0x0) {
          iVar3 = y2;
          if (y1 < y2) {
            iVar3 = y1;
          }
          iVar3 = iVar3 + -1;
          iVar4 = -local_dc;
          do {
            if (((_class *)p_Var10->c_name == garray_class) &&
               (iVar6 = garray_getname((_garray *)p_Var10,&arrayname), iVar6 == 0)) {
              ppcVar21 = (char **)0x149b06;
              iVar6 = glist_fontheight((_glist *)gr);
              iVar3 = iVar3 - iVar6;
              _graph_create_text((_glist *)gr,x1,iVar3,arrayname->s_name,"nw",iVar4,(int)tags3,
                                 ppcVar21);
            }
            p_Var10 = (t_pd)p_Var10->c_helpname;
          } while (p_Var10 != (t_pd)0x0);
        }
        if (*(int *)&gr[8].g_next != 0) {
          iVar3 = y1;
          if (y1 < y2) {
            iVar3 = y2;
          }
          if (y2 < y1) {
            y1 = y2;
          }
          fVar16 = *(float *)&gr[8].g_pd;
          iVar3 = (int)(float)iVar3;
          iVar4 = (int)(float)y1;
          if (fVar16 < *(float *)&gr[6].g_pd * 0.99 + *(float *)&gr[5].g_next * 0.01) {
            iVar6 = 0;
            do {
              bVar13 = iVar6 % *(int *)&gr[8].g_next == 0;
              tVar14 = glist_xtopixels((_glist *)gr,fVar16);
              tVar15 = glist_xtopixels((_glist *)gr,fVar16);
              _graph_create_line4((_glist *)gr,(int)tVar14,iVar3,(int)tVar15,
                                  iVar3 - ((uint)bVar13 * 2 + 2),tags2);
              tVar14 = glist_xtopixels((_glist *)gr,fVar16);
              tVar15 = glist_xtopixels((_glist *)gr,fVar16);
              _graph_create_line4((_glist *)gr,(int)tVar14,iVar4,(int)tVar15,
                                  iVar4 + (uint)bVar13 * 2 + 2,tags2);
              iVar6 = iVar6 + 1;
              fVar16 = fVar16 + *(float *)((long)&gr[8].g_pd + 4);
            } while (fVar16 < *(float *)&gr[6].g_pd * 0.99 + *(float *)&gr[5].g_next * 0.01);
          }
          tVar14 = *(float *)&gr[8].g_pd - *(float *)((long)&gr[8].g_pd + 4);
          if (*(float *)&gr[5].g_next * 0.99 + *(float *)&gr[6].g_pd * 0.01 < tVar14) {
            iVar6 = 1;
            do {
              bVar13 = iVar6 % *(int *)&gr[8].g_next == 0;
              tVar15 = glist_xtopixels((_glist *)gr,tVar14);
              tVar17 = glist_xtopixels((_glist *)gr,tVar14);
              _graph_create_line4((_glist *)gr,(int)tVar15,iVar3,(int)tVar17,
                                  iVar3 - ((uint)bVar13 * 2 + 2),tags2);
              tVar15 = glist_xtopixels((_glist *)gr,tVar14);
              tVar17 = glist_xtopixels((_glist *)gr,tVar14);
              _graph_create_line4((_glist *)gr,(int)tVar15,iVar4,(int)tVar17,
                                  iVar4 + (uint)bVar13 * 2 + 2,tags2);
              iVar6 = iVar6 + 1;
              tVar14 = tVar14 - *(float *)((long)&gr[8].g_pd + 4);
            } while (*(float *)&gr[5].g_next * 0.99 + *(float *)&gr[6].g_pd * 0.01 < tVar14);
          }
        }
        if (*(int *)((long)&gr[10].g_pd + 4) != 0) {
          fVar16 = *(float *)((long)&gr[5].g_next + 4);
          fVar18 = *(float *)((long)&gr[6].g_pd + 4);
          fVar20 = fVar18;
          if (fVar16 <= fVar18) {
            fVar20 = fVar16;
            fVar16 = fVar18;
          }
          fVar18 = *(float *)((long)&gr[9].g_next + 4);
          fVar1 = fVar16 * 0.99 + fVar20 * 0.01;
          if (fVar18 < fVar1) {
            iVar3 = 0;
            do {
              bVar13 = iVar3 % *(int *)((long)&gr[10].g_pd + 4) == 0;
              tVar14 = glist_ytopixels((_glist *)gr,fVar18);
              tVar15 = glist_ytopixels((_glist *)gr,fVar18);
              _graph_create_line4((_glist *)gr,x1,(int)tVar14,x1 + (uint)bVar13 * 2 + 2,(int)tVar15,
                                  tags2);
              tVar14 = glist_ytopixels((_glist *)gr,fVar18);
              tVar15 = glist_ytopixels((_glist *)gr,fVar18);
              _graph_create_line4((_glist *)gr,x2,(int)tVar14,x2 - ((uint)bVar13 * 2 + 2),
                                  (int)tVar15,tags2);
              fVar18 = fVar18 + *(float *)&gr[10].g_pd;
              iVar3 = iVar3 + 1;
            } while (fVar18 < fVar1);
          }
          tVar14 = *(float *)((long)&gr[9].g_next + 4) - *(float *)&gr[10].g_pd;
          fVar16 = fVar20 * 0.99 + fVar16 * 0.01;
          if (fVar16 < tVar14) {
            iVar3 = 1;
            do {
              bVar13 = iVar3 % *(int *)((long)&gr[10].g_pd + 4) == 0;
              tVar15 = glist_ytopixels((_glist *)gr,tVar14);
              tVar17 = glist_ytopixels((_glist *)gr,tVar14);
              _graph_create_line4((_glist *)gr,x1,(int)tVar15,x1 + (uint)bVar13 * 2 + 2,(int)tVar17,
                                  tags2);
              tVar15 = glist_ytopixels((_glist *)gr,tVar14);
              tVar17 = glist_ytopixels((_glist *)gr,tVar14);
              _graph_create_line4((_glist *)gr,x2,(int)tVar15,x2 - ((uint)bVar13 * 2 + 2),
                                  (int)tVar17,tags2);
              tVar14 = tVar14 - *(float *)&gr[10].g_pd;
              iVar3 = iVar3 + 1;
            } while (fVar16 < tVar14);
          }
        }
        iVar3 = local_dc;
        if (0 < *(int *)((long)&gr[8].g_next + 4)) {
          iVar4 = -local_dc;
          lVar12 = 0;
          do {
            dVar19 = atof((&(gr[9].g_pd)->c_name)[lVar12]->s_name);
            tVar14 = glist_xtopixels((_glist *)gr,(float)dVar19);
            ppcVar21 = (char **)0x14a088;
            tVar15 = glist_ytopixels((_glist *)gr,*(t_float *)&gr[9].g_next);
            _graph_create_text((_glist *)gr,(int)tVar14,(int)tVar15,
                               (&(gr[9].g_pd)->c_name)[lVar12]->s_name,anchor_00,iVar4,(int)tags3,
                               ppcVar21);
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)&gr[8].g_next + 4));
        }
        if (0 < *(int *)&gr[10].g_next) {
          lVar12 = 0;
          do {
            tVar14 = glist_xtopixels((_glist *)gr,*(t_float *)&gr[0xb].g_next);
            dVar19 = atof((&(gr[0xb].g_pd)->c_name)[lVar12]->s_name);
            ppcVar21 = (char **)0x14a117;
            tVar15 = glist_ytopixels((_glist *)gr,(float)dVar19);
            _graph_create_text((_glist *)gr,(int)tVar14,(int)tVar15,
                               (&(gr[0xb].g_pd)->c_name)[lVar12]->s_name,anchor,-iVar3,(int)tags3,
                               ppcVar21);
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)&gr[10].g_next);
        }
        for (p_Var10 = gr[3].g_pd; p_Var10 != (t_pd)0x0; p_Var10 = (t_pd)p_Var10->c_helpname) {
          gobj_vis((t_gobj *)p_Var10,(_glist *)gr,1);
        }
      }
    }
    else {
      p_Var2 = gr[4].g_next;
      if (vis == 0) {
        do {
          p_Var8 = p_Var2;
          if (p_Var8[4].g_next == (_gobj *)0x0) break;
          p_Var2 = p_Var8[4].g_next;
        } while (((ulong)p_Var8[0xe].g_next & 0x901) == 0x100);
        pdgui_vmess((char *)0x0,"crs",p_Var8,"delete",tag);
      }
      else {
        do {
          p_Var8 = p_Var2;
          if (p_Var8[4].g_next == (_gobj *)0x0) break;
          p_Var2 = p_Var8[4].g_next;
        } while (((ulong)p_Var8[0xe].g_next & 0x901) == 0x100);
        uVar11 = (ulong)(uint)x1;
        uVar9 = (ulong)(uint)y1;
        uVar5 = glist_getzoom((_glist *)gr);
        pdgui_vmess((char *)0x0,"crr iiiiiiiiii ri rr rr rS",p_Var8,"create","polygon",uVar11,uVar9,
                    uVar11,(ulong)(uint)y2,(ulong)(uint)x2,(ulong)(uint)y2,(ulong)(uint)x2,uVar9,
                    uVar11,uVar9,"-width",(ulong)uVar5,"-fill","#c0c0c0","-joinstyle","miter",
                    "-tags",2,tags2);
      }
    }
  }
  return;
}

Assistant:

static void graph_vis(t_gobj *gr, t_glist *parent_glist, int vis)
{
    t_glist *x = (t_glist *)gr;
    char tag[50];
    const char *tags2[] = {tag, "graph" };
    t_gobj *g;
    int x1, y1, x2, y2;
        /* ordinary subpatches: just act like a text object */
    if (!x->gl_isgraph)
    {
        text_widgetbehavior.w_visfn(gr, parent_glist, vis);
        return;
    }

    if (vis && canvas_showtext(x))
        rtext_draw(glist_findrtext(parent_glist, &x->gl_obj));
    graph_getrect(gr, parent_glist, &x1, &y1, &x2, &y2);
    if (!vis)
        rtext_erase(glist_findrtext(parent_glist, &x->gl_obj));

    sprintf(tag, "graph%lx", (t_int)x);
    if (vis)
        glist_drawiofor(parent_glist, &x->gl_obj, 1,
            tag, x1, y1, x2, y2);
    else glist_eraseiofor(parent_glist, &x->gl_obj, tag);
        /* if we look like a graph but have been moved to a toplevel,
        just show the bounding rectangle */
    if (x->gl_havewindow)
    {
        if (vis)
            pdgui_vmess(0, "crr iiiiiiiiii ri rr rr rS",
                glist_getcanvas(x->gl_owner), "create", "polygon",
                x1,y1, x1,y2, x2,y2, x2,y1, x1,y1,
                "-width", glist_getzoom(x),
                "-fill", "#c0c0c0",
                "-joinstyle", "miter",
                "-tags", 2, tags2);
        else
            pdgui_vmess(0, "crs",
                glist_getcanvas(x->gl_owner), "delete", tag);
        return;
    }
        /* otherwise draw (or erase) us as a graph inside another glist. */
    if (vis)
    {
        int i;
        t_float f;
        t_gobj *g;
        t_symbol *arrayname;
        char *ylabelanchor =
            (x->gl_ylabelx > 0.5*(x->gl_x1 + x->gl_x2) ? "w" : "e");
        char *xlabelanchor =
            (x->gl_xlabely > 0.5*(x->gl_y1 + x->gl_y2) ? "s" : "n");
        int fs = sys_hostfontsize(glist_getfont(x), glist_getzoom(x));
        const char *tags3[] = {tag, "label", "graph" };

            /* draw a rectangle around the graph */
        pdgui_vmess(0, "crr iiiiiiiiii ri rr rS",
                  glist_getcanvas(x->gl_owner),
                  "create", "line",
                  x1,y1, x1,y2, x2,y2, x2,y1, x1,y1,
                  "-width", glist_getzoom(x),
                  "-capstyle", "projecting",
                  "-tags", 2, tags2);
            /* if there's just one "garray" in the graph, write its name
                along the top */
        for (i = (y1 < y2 ? y1 : y2)-1, g = x->gl_list; g; g = g->g_next)
            if (g->g_pd == garray_class &&
                !garray_getname((t_garray *)g, &arrayname))
        {
            i -= glist_fontheight(x);
            _graph_create_text(x,
                x1, i,
                arrayname->s_name,
                "nw", -fs,
                3, tags3);
        }

            /* draw ticks on horizontal borders.  If lperb field is
            zero, this is disabled. */
        if (x->gl_xtick.k_lperb)
        {
            t_float upix, lpix;
            if (y2 < y1)
                upix = y1, lpix = y2;
            else upix = y2, lpix = y1;
            for (i = 0, f = x->gl_xtick.k_point;
                f < 0.99 * x->gl_x2 + 0.01*x->gl_x1; i++,
                    f += x->gl_xtick.k_inc)
            {
                int tickpix = (i % x->gl_xtick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)upix,
                    (int)glist_xtopixels(x, f), (int)upix - tickpix,
                    tags2);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)lpix,
                    (int)glist_xtopixels(x, f), (int)lpix + tickpix,
                    tags2);
            }
            for (i = 1, f = x->gl_xtick.k_point - x->gl_xtick.k_inc;
                f > 0.99 * x->gl_x1 + 0.01*x->gl_x2;
                    i++, f -= x->gl_xtick.k_inc)
            {
                int tickpix = (i % x->gl_xtick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)upix,
                    (int)glist_xtopixels(x, f), (int)upix - tickpix,
                    tags2);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)lpix,
                    (int)glist_xtopixels(x, f), (int)lpix + tickpix,
                    tags2);
            }
        }

            /* draw ticks in vertical borders*/
        if (x->gl_ytick.k_lperb)
        {
            t_float ubound, lbound;
            if (x->gl_y2 < x->gl_y1)
                ubound = x->gl_y1, lbound = x->gl_y2;
            else ubound = x->gl_y2, lbound = x->gl_y1;
            for (i = 0, f = x->gl_ytick.k_point;
                f < 0.99 * ubound + 0.01 * lbound;
                    i++, f += x->gl_ytick.k_inc)
            {
                int tickpix = (i % x->gl_ytick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    x1, (int)glist_ytopixels(x, f),
                    x1 + tickpix, (int)glist_ytopixels(x, f),
                    tags2);
                _graph_create_line4(x,
                    x2, (int)glist_ytopixels(x, f),
                    x2 - tickpix, (int)glist_ytopixels(x, f),
                    tags2);
            }
            for (i = 1, f = x->gl_ytick.k_point - x->gl_ytick.k_inc;
                f > 0.99 * lbound + 0.01 * ubound;
                    i++, f -= x->gl_ytick.k_inc)
            {
                int tickpix = (i % x->gl_ytick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    x1, (int)glist_ytopixels(x, f),
                    x1 + tickpix, (int)glist_ytopixels(x, f),
                    tags2);
                _graph_create_line4(x,
                    x2, (int)glist_ytopixels(x, f),
                    x2 - tickpix, (int)glist_ytopixels(x, f),
                    tags2);
            }
        }
            /* draw x labels */
        for (i = 0; i < x->gl_nxlabels; i++)
            _graph_create_text(x,
                (int)glist_xtopixels(x, atof(x->gl_xlabel[i]->s_name)),
                (int)glist_ytopixels(x, x->gl_xlabely),
                x->gl_xlabel[i]->s_name,
                xlabelanchor, -fs,
                3, tags3);
            /* draw y labels */
        for (i = 0; i < x->gl_nylabels; i++)
            _graph_create_text(x,
                (int)glist_xtopixels(x, x->gl_ylabelx),
                (int)glist_ytopixels(x, atof(x->gl_ylabel[i]->s_name)),
                x->gl_ylabel[i]->s_name,
                ylabelanchor, -fs,
                3, tags3);

            /* draw contents of graph as glist */
        for (g = x->gl_list; g; g = g->g_next)
            gobj_vis(g, x, 1);
    }
    else
    {
        pdgui_vmess(0, "crs", glist_getcanvas(x->gl_owner), "delete", tag);
        for (g = x->gl_list; g; g = g->g_next)
            gobj_vis(g, x, 0);
    }
}